

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

Layer * ncnn::Proposal_layer_creator(void)

{
  Layer *pLVar1;
  Proposal *in_stack_00000040;
  
  pLVar1 = (Layer *)operator_new(0x158);
  Proposal::Proposal(in_stack_00000040);
  return pLVar1;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}